

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O3

void aom_avg_8x8_quad_sse2(uint8_t *s,int p,int x16_idx,int y16_idx,int *avg)

{
  bool bVar1;
  undefined1 (*pauVar2) [16];
  long lVar3;
  long lVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  pauVar2 = (undefined1 (*) [16])(s + (long)(y16_idx * p) + (long)x16_idx);
  lVar3 = (long)p;
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar5 = bVar1;
    auVar6 = psadbw(*pauVar2,(undefined1  [16])0x0);
    auVar10 = psadbw(*(undefined1 (*) [16])(*pauVar2 + lVar3),(undefined1  [16])0x0);
    auVar7 = psadbw(*(undefined1 (*) [16])(*pauVar2 + lVar3 * 2),(undefined1  [16])0x0);
    auVar13 = psadbw(*(undefined1 (*) [16])(*pauVar2 + lVar3 * 3),(undefined1  [16])0x0);
    auVar8 = psadbw(*(undefined1 (*) [16])(*pauVar2 + lVar3 * 4),(undefined1  [16])0x0);
    auVar11 = psadbw(*(undefined1 (*) [16])(*pauVar2 + lVar3 * 5),(undefined1  [16])0x0);
    auVar9 = psadbw(*(undefined1 (*) [16])(*pauVar2 + lVar3 * 6),(undefined1  [16])0x0);
    auVar12 = psadbw(*(undefined1 (*) [16])(*pauVar2 + lVar3 * 7),(undefined1  [16])0x0);
    *(uint *)((long)avg + lVar4) =
         CONCAT22(auVar12._2_2_ +
                  auVar9._2_2_ + auVar11._2_2_ + auVar8._2_2_ +
                  auVar13._2_2_ + auVar7._2_2_ + auVar10._2_2_ + auVar6._2_2_,
                  auVar12._0_2_ +
                  auVar9._0_2_ + auVar11._0_2_ + auVar8._0_2_ +
                  auVar13._0_2_ + auVar7._0_2_ + auVar10._0_2_ + auVar6._0_2_) + 0x20U >> 6;
    *(uint *)((long)avg + lVar4 + 4) =
         CONCAT22(auVar12._10_2_ +
                  auVar9._10_2_ + auVar11._10_2_ + auVar8._10_2_ +
                  auVar13._10_2_ + auVar7._10_2_ + auVar10._10_2_ + auVar6._10_2_,
                  auVar12._8_2_ +
                  auVar9._8_2_ + auVar11._8_2_ + auVar8._8_2_ +
                  auVar13._8_2_ + auVar7._8_2_ + auVar10._8_2_ + auVar6._8_2_) + 0x20U >> 6 & 0xffff
    ;
    pauVar2 = (undefined1 (*) [16])(*pauVar2 + p * 8);
    lVar4 = 8;
    bVar1 = false;
  } while (bVar5);
  return;
}

Assistant:

void aom_avg_8x8_quad_sse2(const uint8_t *s, int p, int x16_idx, int y16_idx,
                           int *avg) {
  const uint8_t *s_ptr = s + y16_idx * p + x16_idx;
  for (int k = 0; k < 2; k++) {
    calc_avg_8x8_dual_sse2(s_ptr, p, avg + k * 2);
    s_ptr += 8 * p;
  }
}